

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O0

OptionalStorage<llvm::object::SectionedAddress,_true> * __thiscall
llvm::optional_detail::OptionalStorage<llvm::object::SectionedAddress,_true>::operator=
          (OptionalStorage<llvm::object::SectionedAddress,_true> *this,SectionedAddress *y)

{
  bool bVar1;
  SectionedAddress *y_local;
  OptionalStorage<llvm::object::SectionedAddress,_true> *this_local;
  
  bVar1 = hasValue(this);
  if (bVar1) {
    (this->field_0).value.Address = y->Address;
    (this->field_0).value.SectionIndex = y->SectionIndex;
  }
  else {
    (this->field_0).value.Address = y->Address;
    (this->field_0).value.SectionIndex = y->SectionIndex;
    this->hasVal = true;
  }
  return this;
}

Assistant:

OptionalStorage &operator=(T &&y) {
    if (hasValue()) {
      value = std::move(y);
    } else {
      ::new ((void *)std::addressof(value)) T(std::move(y));
      hasVal = true;
    }
    return *this;
  }